

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O0

void __thiscall MyServerConnection::OnTick(MyServerConnection *this,uint64_t nowUsec)

{
  uint32_t value;
  undefined1 auVar1 [16];
  uint16_t value_00;
  int iVar2;
  uint32_t uVar3;
  FunctionTimer *in_RDI;
  uint32_t ts23;
  uint16_t ts16;
  uint i_1;
  uint8_t data_1 [1400];
  uint i;
  uint packetsToSend;
  uint bytes;
  uint fillMsec;
  uint8_t data [2];
  TonkStatus status;
  undefined4 in_stack_fffffffffffffa28;
  undefined2 in_stack_fffffffffffffa2c;
  undefined1 in_stack_fffffffffffffa2e;
  uint8_t in_stack_fffffffffffffa2f;
  SDKResult in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  uint local_5bc;
  uint8_t local_5b8 [744];
  SDKConnection *in_stack_fffffffffffffd30;
  uint local_40;
  uint local_28;
  uint local_20;
  uint local_18;
  
  iVar2 = (int)in_RDI->Invokations + 1;
  *(int *)&in_RDI->Invokations = iVar2;
  if (99 < iVar2) {
    *(undefined4 *)&in_RDI->Invokations = 0;
    test::LogTonkStatus(in_stack_fffffffffffffd30);
  }
  tonk::SDKConnection::GetStatus((SDKConnection *)in_RDI);
  OnTick::counter = OnTick::counter + '\x01';
  tonk::SDKConnection::Send
            ((SDKConnection *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38.Result),
             in_RDI,CONCAT17(in_stack_fffffffffffffa2f,
                             CONCAT16(in_stack_fffffffffffffa2e,
                                      CONCAT24(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28))
                            ),0);
  if (local_18 < 0x32) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)local_20 * (ulong)(0x32 - local_18);
    for (local_40 = 0; local_40 < (SUB164(auVar1 / ZEXT816(1000),0) + 0x577U) / 0x578;
        local_40 = local_40 + 1) {
      memset(local_5b8,0,0x578);
      for (local_5bc = 0; local_5bc < 0x578; local_5bc = local_5bc + 1) {
        local_5b8[local_5bc] = (uint8_t)local_5bc;
      }
      value_00 = tonk::SDKConnection::ToRemoteTime16
                           ((SDKConnection *)in_RDI,
                            CONCAT17(in_stack_fffffffffffffa2f,
                                     CONCAT16(in_stack_fffffffffffffa2e,
                                              CONCAT24(in_stack_fffffffffffffa2c,
                                                       in_stack_fffffffffffffa28))));
      uVar3 = tonk::SDKConnection::ToRemoteTime23
                        ((SDKConnection *)in_RDI,
                         CONCAT17(in_stack_fffffffffffffa2f,
                                  CONCAT16(in_stack_fffffffffffffa2e,
                                           CONCAT24(in_stack_fffffffffffffa2c,
                                                    in_stack_fffffffffffffa28))));
      in_stack_fffffffffffffa2e = 7;
      in_stack_fffffffffffffa2f = '\b';
      if ((local_28 & 1) == 0) {
        in_stack_fffffffffffffa2f = '\a';
      }
      local_5b8[0] = in_stack_fffffffffffffa2f;
      tonk::WriteU16_LE(local_5b8 + 1,value_00);
      tonk::WriteU24_LE((uint8_t *)in_RDI,
                        CONCAT13(in_stack_fffffffffffffa2f,
                                 CONCAT12(in_stack_fffffffffffffa2e,in_stack_fffffffffffffa2c)));
      tonk::WriteU24_LE((uint8_t *)in_RDI,
                        CONCAT13(in_stack_fffffffffffffa2f,
                                 CONCAT12(in_stack_fffffffffffffa2e,in_stack_fffffffffffffa2c)));
      value = *(uint32_t *)
               &((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&in_RDI[0x54].CallLock.super___mutex_base._M_mutex + 0x10))->_M_pi;
      *(uint32_t *)
       &((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
        ((long)&in_RDI[0x54].CallLock.super___mutex_base._M_mutex + 0x10))->_M_pi = value + 1;
      tonk::WriteU32_LE(local_5b8 + 9,value);
      test::FunctionTimer::BeginCall(in_RDI);
      in_stack_fffffffffffffa38 =
           tonk::SDKConnection::Send
                     ((SDKConnection *)CONCAT44(uVar3,in_stack_fffffffffffffa38.Result),in_RDI,
                      CONCAT17(in_stack_fffffffffffffa2f,
                               CONCAT16(in_stack_fffffffffffffa2e,
                                        CONCAT24(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28
                                                ))),0);
      test::FunctionTimer::EndCall(in_RDI);
    }
  }
  return;
}

Assistant:

void MyServerConnection::OnTick(
    uint64_t          nowUsec   // Current timestamp in microseconds
)
{
    if (++StatusLogCounter >= 100)
    {
        StatusLogCounter = 0;
        LogTonkStatus(this);
    }

    TonkStatus status = GetStatus();

    {
        static uint8_t counter = 0;
        uint8_t data[2] = { 200, ++counter };
        Send(data, sizeof(data), TonkChannel_Unordered);
    }

#ifdef TONK_ENABLE_1MBPS_DATA_SERVER
    if (status.LowPriQueueMsec < kLowPriQueueDepthMsec)
    {
        unsigned fillMsec = kLowPriQueueDepthMsec - status.LowPriQueueMsec;
        unsigned bytes = (unsigned)(((uint64_t)status.AppBPS * fillMsec) / 1000);
        unsigned packetsToSend = (bytes + kLowPriBulkData_Bytes - 1) / kLowPriBulkData_Bytes;
        for (unsigned i = 0; i < packetsToSend; ++i)
        {
            uint8_t data[kLowPriBulkData_Bytes] = {};
            for (unsigned i = 0; i < kLowPriBulkData_Bytes; ++i) {
                data[i] = (uint8_t)i;
            }

            const uint16_t ts16 = ToRemoteTime16(nowUsec);
            const uint32_t ts23 = ToRemoteTime23(nowUsec);

            data[0] = (status.Flags & TonkFlag_TimeSync) ? ID_LowPriBulkData_HasTimestamp : ID_LowPriBulkData_NoTimestamp;
            tonk::WriteU16_LE(data + 1, ts16);
            tonk::WriteU24_LE(data + 1 + 2, ts23);
            tonk::WriteU24_LE(data + 1 + 2 + 3, kLowPriBulkMagic);
            tonk::WriteU32_LE(data + 1 + 2 + 3 + 3, NextOutgoingWord++);

            t_tonk_send.BeginCall();
            Send(data, sizeof(data), kLowPriBulkData_Channel);
            t_tonk_send.EndCall();
        }
    }
#endif
}